

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O0

bool __thiscall glslang::TPpContext::tMacroInput::endOfReplacementList(tMacroInput *this)

{
  bool bVar1;
  tMacroInput *this_local;
  
  bVar1 = TokenStream::atEnd(&this->mac->body);
  return bVar1;
}

Assistant:

bool endOfReplacementList() override { return mac->body.atEnd(); }